

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

double * seasdummy(double *x,int N,int f,int *rows,int *cols)

{
  size_t __size;
  double dVar1;
  uint N_00;
  void *__ptr;
  void *__ptr_00;
  double *A;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  ulong local_68;
  
  if (f < 2) {
    puts("Non-Seasonal Data ");
    exit(-1);
  }
  uVar8 = (ulong)(uint)f;
  __size = (long)N * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(uVar8 * (long)N * 0x10);
  N_00 = f - 1;
  A = (double *)malloc(__size * N_00);
  uVar5 = 0;
  local_68 = 0;
  if (0 < N) {
    local_68 = (ulong)(uint)N;
  }
  while (local_68 != uVar5) {
    *(double *)((long)__ptr + uVar5 * 8) = (double)(int)(uVar5 + 1);
    uVar5 = uVar5 + 1;
  }
  pdVar2 = (double *)((long)__ptr_00 + 8);
  lVar3 = 0;
  for (uVar5 = 0; uVar5 != local_68; uVar5 = uVar5 + 1) {
    dVar1 = *(double *)((long)__ptr + uVar5 * 8);
    pdVar6 = pdVar2;
    lVar7 = lVar3;
    for (uVar4 = 1; f + 1 != uVar4; uVar4 = uVar4 + 1) {
      dVar10 = ((double)(int)uVar4 * 6.283185307179586 * dVar1) / (double)f;
      dVar11 = sin(dVar10);
      *pdVar6 = dVar11;
      dVar10 = cos(dVar10);
      *(double *)((long)__ptr_00 + (lVar7 >> 0x1d)) = dVar10;
      pdVar6 = pdVar6 + 2;
      lVar7 = lVar7 + 0x200000000;
    }
    pdVar2 = pdVar2 + uVar8 * 2;
    lVar3 = lVar3 + (uVar8 << 0x21);
  }
  printf("PIVAL %g",0x400921fb54442d18);
  uVar5 = 0;
  pdVar2 = A;
  while (bVar9 = local_68 != 0, local_68 = local_68 - 1, bVar9) {
    memcpy(pdVar2,(void *)((long)__ptr_00 + uVar5 * 8),(ulong)N_00 * 8);
    uVar5 = (ulong)(uint)((int)uVar5 + f * 2);
    pdVar2 = pdVar2 + (int)N_00;
  }
  itranspose(A,N,N_00);
  *rows = N_00;
  *cols = N;
  free(__ptr);
  free(__ptr_00);
  return A;
}

Assistant:

double* seasdummy(double *x, int N,int f,int *rows, int *cols) {
    int i,j,iter;
    double *tt;
    double *fmatrix,*oup;
    if ( f <= 1) {
        printf("Non-Seasonal Data \n");
        exit(-1);
    }

    tt = (double*) malloc(sizeof(double)*N);
    fmatrix = (double*)malloc(sizeof(double)*N*2*f);
    oup = (double*)malloc(sizeof(double)*N*(f-1));

    for(i = 0; i < N;++i) {
        tt[i] = (double) i + 1;
    }

    for(i = 0; i < N; ++i) {
        iter = i * 2 * f;
        for(j = 1; j <= f; ++j) {
            fmatrix[iter + 2 * j - 1 ] = sin(2 * (double) PIVAL * j * tt[i] / (double) f);
            fmatrix[iter + 2 * (j - 1) ] = cos(2 * (double) PIVAL * j * tt[i] /(double) f);
            //printf("%d %d \n",iter + 2 * j,iter + 2 * j+1);
        }
    }

    printf("PIVAL %g",PIVAL);

    //mdisplay(fmatrix,N,2*f);

    for(i = 0; i < N;++i) {
        memcpy(oup + i * (f-1),fmatrix + i * 2 * f,sizeof(double)* (f-1));
    }

    itranspose(oup,N,f-1);

    *rows = f-1;
    *cols = N;

    free(tt);
    free(fmatrix);
    return oup;
}